

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.cpp
# Opt level: O2

void __thiscall QPainter::fillRect(QPainter *this,QRect *r,QColor *color)

{
  _Head_base<0UL,_QPainterPrivate_*,_false> _Var1;
  QPaintEngineEx *pQVar2;
  long in_FS_OFFSET;
  QRectF local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QPainterPrivate,_std::default_delete<QPainterPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QPainterPrivate_*,_std::default_delete<QPainterPrivate>_>.
       super__Head_base<0UL,_QPainterPrivate_*,_false>._M_head_impl;
  if ((tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor>)
      *(tuple<QPaintEngine_*,_QPainterPrivate::QPaintEngineDestructor> *)
       &((_Var1._M_head_impl)->engine)._M_t ==
      (__uniq_ptr_impl<QPaintEngine,_QPainterPrivate::QPaintEngineDestructor>)0x0) {
    local_48.xp._0_4_ = 2;
    local_48.w._4_4_ = 0;
    local_48._4_8_ = 0;
    local_48._12_8_ = 0;
    local_48.h = 3.07579085621531e-317;
    QMessageLogger::warning((char *)&local_48,"QPainter::fillRect: Painter not active");
  }
  else {
    pQVar2 = (_Var1._M_head_impl)->extended;
    if (pQVar2 == (QPaintEngineEx *)0x0) {
      QBrush::QBrush((QBrush *)&local_48,color,SolidPattern);
      fillRect(this,r,(QBrush *)&local_48);
      QBrush::~QBrush((QBrush *)&local_48);
    }
    else {
      QRectF::QRectF(&local_48,r);
      (**(code **)(*(long *)&pQVar2->super_QPaintEngine + 0x148))(pQVar2,&local_48,color);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainter::fillRect(const QRect &r, const QColor &color)
{
    Q_D(QPainter);

    if (!d->engine) {
        qWarning("QPainter::fillRect: Painter not active");
        return;
    }

    if (d->extended) {
        d->extended->fillRect(r, color);
        return;
    }

    fillRect(r, QBrush(color));
}